

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate.c
# Opt level: O1

int cm_zlib_inflateResetKeep(z_streamp strm)

{
  ct_data_s *pcVar1;
  internal_state *piVar2;
  int iVar3;
  int iVar4;
  
  iVar3 = inflateStateCheck(strm);
  iVar4 = -2;
  if (iVar3 == 0) {
    piVar2 = strm->state;
    iVar4 = 0;
    piVar2->pending = 0;
    strm->total_in = 0;
    strm->total_out = 0;
    strm->msg = (char *)0x0;
    if (*(uint *)&piVar2->pending_buf != 0) {
      strm->adler = (ulong)(*(uint *)&piVar2->pending_buf & 1);
    }
    *(undefined8 *)&piVar2->status = 0x3f34;
    *(undefined8 *)((long)&piVar2->pending_buf + 4) = 0xffffffff00000000;
    *(undefined4 *)((long)&piVar2->pending_buf_size + 4) = 0x8000;
    *(undefined8 *)&piVar2->wrap = 0;
    piVar2->w_size = 0;
    piVar2->w_bits = 0;
    piVar2->w_mask = 0;
    pcVar1 = piVar2->dyn_ltree + 0x121;
    *(ct_data_s **)&piVar2->hash_shift = pcVar1;
    piVar2->prev = (Posf *)pcVar1;
    piVar2->window_size = (ulg)pcVar1;
    piVar2[1].dyn_ltree[0xf5].fc = (anon_union_2_2_314cc5cc_for_fc)0x1;
    piVar2[1].dyn_ltree[0xf5].dl = (anon_union_2_2_43a7fb4f_for_dl)0x0;
    piVar2[1].dyn_ltree[0xf6].fc = (anon_union_2_2_314cc5cc_for_fc)0xffff;
    piVar2[1].dyn_ltree[0xf6].dl = (anon_union_2_2_43a7fb4f_for_dl)0xffff;
  }
  return iVar4;
}

Assistant:

int ZEXPORT inflateResetKeep(strm)
z_streamp strm;
{
    struct inflate_state FAR *state;

    if (inflateStateCheck(strm)) return Z_STREAM_ERROR;
    state = (struct inflate_state FAR *)strm->state;
    strm->total_in = strm->total_out = state->total = 0;
    strm->msg = Z_NULL;
    if (state->wrap)        /* to support ill-conceived Java test suite */
        strm->adler = state->wrap & 1;
    state->mode = HEAD;
    state->last = 0;
    state->havedict = 0;
    state->flags = -1;
    state->dmax = 32768U;
    state->head = Z_NULL;
    state->hold = 0;
    state->bits = 0;
    state->lencode = state->distcode = state->next = state->codes;
    state->sane = 1;
    state->back = -1;
    Tracev((stderr, "inflate: reset\n"));
    return Z_OK;
}